

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxerutil.cc
# Opt level: O0

int32 mkvmuxer::GetUIntSize(uint64 value)

{
  uint64 value_local;
  
  if (value < 0x100) {
    value_local._4_4_ = 1;
  }
  else if (value < 0x10000) {
    value_local._4_4_ = 2;
  }
  else if (value < 0x1000000) {
    value_local._4_4_ = 3;
  }
  else if (value < 0x100000000) {
    value_local._4_4_ = 4;
  }
  else if (value < 0x10000000000) {
    value_local._4_4_ = 5;
  }
  else if (value < 0x1000000000000) {
    value_local._4_4_ = 6;
  }
  else if (value < 0x100000000000000) {
    value_local._4_4_ = 7;
  }
  else {
    value_local._4_4_ = 8;
  }
  return value_local._4_4_;
}

Assistant:

int32 GetUIntSize(uint64 value) {
  if (value < 0x0000000000000100ULL)
    return 1;
  else if (value < 0x0000000000010000ULL)
    return 2;
  else if (value < 0x0000000001000000ULL)
    return 3;
  else if (value < 0x0000000100000000ULL)
    return 4;
  else if (value < 0x0000010000000000ULL)
    return 5;
  else if (value < 0x0001000000000000ULL)
    return 6;
  else if (value < 0x0100000000000000ULL)
    return 7;
  return 8;
}